

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void MeCab::remove_filename(string *s)

{
  char *pcVar1;
  string *in_RDI;
  bool ok;
  int len;
  string local_30 [35];
  byte local_d;
  int local_c;
  string *local_8;
  
  local_8 = in_RDI;
  local_c = std::__cxx11::string::size();
  local_d = 0;
  do {
    local_c = local_c + -1;
    if (local_c < 0) goto LAB_001bb2e3;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_8);
  } while (*pcVar1 != '/');
  local_d = 1;
LAB_001bb2e3:
  if ((local_d & 1) == 0) {
    std::__cxx11::string::operator=(local_8,".");
  }
  else {
    std::__cxx11::string::substr((ulong)local_30,(ulong)local_8);
    std::__cxx11::string::operator=(local_8,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void remove_filename(std::string *s) {
  int len = static_cast<int>(s->size()) - 1;
  bool ok = false;
  for (; len >= 0; --len) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    if ((*s)[len] == '\\') {
      ok = true;
      break;
    }
#else
    if ((*s)[len] == '/')  {
      ok = true;
      break;
    }
#endif
  }
  if (ok)
    *s = s->substr(0, len);
  else
    *s = ".";
}